

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

int __thiscall
jsoncons::jsonpath::detail::
index_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(index_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  size_t i_00;
  size_t sVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar2;
  fd_set *pfVar3;
  uint uVar4;
  fd_set *pfVar5;
  size_t i;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
  *this_00;
  supertype *psVar6;
  _func_int **pp_Var7;
  size_t i_1;
  size_t i_01;
  uint in_stack_00000008;
  size_t local_48;
  fd_set *local_40;
  basic_path_node<char> *local_38;
  
  this_00 = (eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
             *)CONCAT44(in_register_00000034,__nfds);
  pfVar3 = __exceptfds;
  while (uVar4 = (byte)pfVar3->fds_bits[0] & 0xf, uVar4 - 8 < 2) {
    pfVar3 = (fd_set *)pfVar3->fds_bits[1];
  }
  if (uVar4 != 0xe) goto LAB_003c17ba;
  local_40 = __readfds;
  sVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)__exceptfds
                    );
  pfVar5 = local_40;
  i_00 = this->index_;
  if ((long)i_00 < (long)sVar1 && -1 < (long)i_00) {
    local_48 = i_00;
    if ((in_stack_00000008 & 0xb) != 0) {
      local_38 = (basic_path_node<char> *)__writefds;
      __writefds = (fd_set *)
                   eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                   ::
                   create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                             (this_00,&local_38,&local_48);
    }
    pbVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        __exceptfds,i_00);
    psVar6 = (this->
             super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ).tail_;
    if (psVar6 == (supertype *)0x0) {
LAB_003c17ab:
      pfVar3 = (fd_set *)(**(code **)(__timeout->tv_sec + 0x10))(__timeout,__writefds,pbVar2);
      goto LAB_003c17ba;
    }
    pp_Var7 = psVar6->_vptr_jsonpath_selector;
    pfVar5 = local_40;
  }
  else {
    i_01 = sVar1 + i_00;
    pfVar3 = (fd_set *)CONCAT71((int7)(sVar1 >> 8),(long)i_01 < 0);
    if (-1 < (long)i_00 || (long)i_01 < 0) goto LAB_003c17ba;
    local_48 = i_01;
    if ((in_stack_00000008 & 0xb) != 0) {
      local_38 = (basic_path_node<char> *)__writefds;
      __writefds = (fd_set *)
                   eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                   ::
                   create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                             (this_00,&local_38,&local_48);
    }
    pbVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        __exceptfds,i_01);
    psVar6 = (this->
             super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ).tail_;
    if (psVar6 == (supertype *)0x0) goto LAB_003c17ab;
    pp_Var7 = psVar6->_vptr_jsonpath_selector;
  }
  uVar4 = (*pp_Var7[2])(psVar6,this_00,pfVar5,__writefds,pbVar2,__timeout,in_stack_00000008);
  pfVar3 = (fd_set *)(ulong)uVar4;
LAB_003c17ba:
  return (int)pfVar3;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                auto slen = static_cast<int64_t>(current.size());
                if (index_ >= 0 && index_ < slen)
                {
                    auto i = static_cast<std::size_t>(index_);
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, i, options), 
                                        current.at(i), receiver, options);
                }
                else 
                {
                    int64_t index = slen + index_;
                    if (index >= 0 && index < slen)
                    {
                        auto i = static_cast<std::size_t>(index);
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, i, options), 
                                            current.at(i), receiver, options);
                    }
                }
            }
        }